

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionFlowElementType::~IfcDistributionFlowElementType
          (IfcDistributionFlowElementType *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined8 *)
   &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x28 = 0x7e6588;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x10 = 0x7e6650;
  *(undefined8 *)
   &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x18 =
       0x7e65b0;
  *(undefined8 *)
   &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xc0 = 0x7e65d8;
  *(undefined8 *)
   &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x118
       = 0x7e6600;
  *(undefined8 *)&this[-1].super_IfcDistributionElementType.super_IfcElementType.field_0x170 =
       0x7e6628;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcDistributionElementType.super_IfcElementType.field_0x180;
  puVar1 = &this[-1].super_IfcDistributionElementType.super_IfcElementType.field_0x190;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)
   &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x28 = 0x7e6678;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x10 = 0x7e6718;
  *(undefined8 *)
   &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x18 =
       0x7e66a0;
  *(undefined8 *)
   &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xc0 = 0x7e66c8;
  *(undefined8 *)
   &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x118
       = 0x7e66f0;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             field_0x148;
  puVar1 = &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
            field_0x158;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = &this[-1].super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
            super_IfcTypeObject.field_0x28;
  pvVar3 = (void *)this[-1].super_IfcDistributionElementType.super_IfcElementType.
                   super_IfcTypeProduct.Tag.ptr._M_string_length;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)((long)&this[-1].super_IfcDistributionElementType.
                                            super_IfcElementType.super_IfcTypeProduct.Tag.ptr.
                                            field_2 + 8) - (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)puVar1,&PTR_construction_vtable_24__007e62f0);
  operator_delete(puVar1,0x1b8);
  return;
}

Assistant:

IfcDistributionFlowElementType() : Object("IfcDistributionFlowElementType") {}